

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tommyarrayblk.c
# Opt level: O3

void tommy_arrayblk_grow(tommy_arrayblk *array,tommy_count_t count)

{
  uint uVar1;
  long lVar2;
  void *pvVar3;
  uint uVar4;
  int iVar5;
  ulong uVar6;
  long in_FS_OFFSET;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  if (array->count < count) {
    array->count = count;
    uVar4 = count + 0xfff >> 0xc;
    uVar1 = (array->block).count;
    uVar6 = (ulong)uVar1;
    if (uVar1 < uVar4) {
      tommy_array_grow(&array->block,uVar4);
      iVar5 = uVar4 - uVar1;
      do {
        pvVar3 = lrtr_calloc(0x1000,8);
        if ((array->block).count <= uVar6) {
          __assert_fail("pos < array->count",
                        "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/third-party/tommyds/tommyarray.h"
                        ,0x61,"void **tommy_array_ref(tommy_array *, tommy_count_t)");
        }
        uVar4 = (uint)uVar6 | 1;
        uVar1 = 0x1f;
        if (uVar4 != 0) {
          for (; uVar4 >> uVar1 == 0; uVar1 = uVar1 - 1) {
          }
        }
        (array->block).bucket[uVar1][uVar6] = pvVar3;
        uVar6 = uVar6 + 1;
        iVar5 = iVar5 + -1;
      } while (iVar5 != 0);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void tommy_arrayblk_grow(tommy_arrayblk* array, tommy_count_t count)
{
	tommy_count_t block_max;
	tommy_count_t block_mac;

	if (array->count >= count)
		return;
	array->count = count;

	block_max = (count + TOMMY_ARRAYBLK_SIZE - 1) / TOMMY_ARRAYBLK_SIZE;
	block_mac = tommy_array_size(&array->block);

	if (block_mac < block_max) {
		/* grow the block array */
		tommy_array_grow(&array->block, block_max);

		/* allocate new blocks */
		while (block_mac < block_max) {
			void** ptr = tommy_cast(void**, tommy_calloc(TOMMY_ARRAYBLK_SIZE, sizeof(void*)));

			/* set the new block */
			tommy_array_set(&array->block, block_mac, ptr);

			++block_mac;
		}
	}
}